

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O0

int dwarf_child(Dwarf_Die die,Dwarf_Die *caller_ret_die,Dwarf_Error *error)

{
  Dwarf_Byte_Ptr pDVar1;
  Dwarf_Unsigned dbg_00;
  int iVar2;
  char *msg;
  Dwarf_Byte_Ptr abbrev_end_00;
  Dwarf_Debug_InfoTypes_s *local_d8;
  Dwarf_Byte_Ptr abbrev_end;
  Dwarf_Byte_Ptr abbrev_ptr;
  undefined1 local_b8 [4];
  int bres;
  dwarfstring m;
  Dwarf_Debug ckdi_dbg;
  Dwarf_Unsigned highest_code;
  Dwarf_CU_Context_conflict pDStack_80;
  int lres;
  Dwarf_CU_Context_conflict context;
  Dwarf_Debug_InfoTypes_s *pDStack_70;
  int res;
  Dwarf_Debug_InfoTypes dis;
  Dwarf_Unsigned utmp;
  Dwarf_Unsigned abbrev_code;
  Dwarf_Debug dbg;
  Dwarf_Die pDStack_48;
  Dwarf_Bool has_die_child;
  Dwarf_Die ret_die;
  Dwarf_Byte_Ptr die_info_end;
  Dwarf_Byte_Ptr die_info_ptr2;
  Dwarf_Byte_Ptr die_info_ptr;
  Dwarf_Error *error_local;
  Dwarf_Die *caller_ret_die_local;
  Dwarf_Die die_local;
  
  die_info_ptr2 = (Dwarf_Byte_Ptr)0x0;
  die_info_end = (Dwarf_Byte_Ptr)0x0;
  ret_die = (Dwarf_Die)0x0;
  pDStack_48 = (Dwarf_Die)0x0;
  dbg._4_4_ = 0;
  utmp = 0;
  dis = (Dwarf_Debug_InfoTypes)0x0;
  pDStack_70 = (Dwarf_Debug_InfoTypes_s *)0x0;
  context._4_4_ = 0;
  pDStack_80 = (Dwarf_CU_Context_conflict)0x0;
  highest_code._4_4_ = 0;
  ckdi_dbg = (Dwarf_Debug)0x0;
  m.s_malloc = '\0';
  m._25_7_ = 0;
  die_info_ptr = (Dwarf_Byte_Ptr)error;
  error_local = (Dwarf_Error *)caller_ret_die;
  caller_ret_die_local = (Dwarf_Die *)die;
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    m._24_8_ = die->di_cu_context->cc_dbg;
    if (((Dwarf_Debug)m._24_8_ == (Dwarf_Debug)0x0) ||
       (((Dwarf_Debug)m._24_8_)->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      abbrev_code = (Dwarf_Unsigned)die->di_cu_context->cc_dbg;
      if (die->di_is_info == 0) {
        local_d8 = &((Dwarf_Debug)abbrev_code)->de_types_reading;
      }
      else {
        local_d8 = &((Dwarf_Debug)abbrev_code)->de_info_reading;
      }
      pDStack_70 = local_d8;
      die_info_ptr2 = die->di_debug_ptr;
      local_d8->de_last_die = die;
      local_d8->de_last_di_ptr = die_info_ptr2;
      if (*die_info_ptr2 == '\0') {
        die_local._4_4_ = -1;
      }
      else {
        pDStack_80 = die->di_cu_context;
        ret_die = (Dwarf_Die)_dwarf_calculate_info_section_end_ptr(pDStack_80);
        context._4_4_ =
             _dwarf_next_die_info_ptr
                       (die_info_ptr2,(Dwarf_CU_Context_conflict)caller_ret_die_local[2],
                        (Dwarf_Byte_Ptr)ret_die,(Dwarf_Byte_Ptr)0x0,0,(Dwarf_Bool *)((long)&dbg + 4)
                        ,&die_info_end,(Dwarf_Error *)die_info_ptr);
        die_local._4_4_ = context._4_4_;
        if (context._4_4_ == 0) {
          if ((Dwarf_Die)die_info_ptr2 == ret_die) {
            die_local._4_4_ = -1;
          }
          else {
            die_info_ptr2 = die_info_end;
            pDStack_70->de_last_di_ptr = die_info_end;
            if (dbg._4_4_ == 0) {
              while (((Dwarf_Die)pDStack_70->de_last_di_ptr < ret_die &&
                     (*pDStack_70->de_last_di_ptr == '\0'))) {
                pDStack_70->de_last_di_ptr = pDStack_70->de_last_di_ptr + 1;
              }
              die_local._4_4_ = -1;
            }
            else {
              pDStack_48 = (Dwarf_Die)_dwarf_get_alloc((Dwarf_Debug)abbrev_code,'\b',1);
              if (pDStack_48 == (Dwarf_Die)0x0) {
                _dwarf_error((Dwarf_Debug)abbrev_code,(Dwarf_Error *)die_info_ptr,0x3e);
                die_local._4_4_ = 1;
              }
              else {
                pDStack_48->di_debug_ptr = die_info_ptr2;
                pDStack_48->di_cu_context = (Dwarf_CU_Context_conflict)caller_ret_die_local[2];
                pDStack_48->di_is_info = *(Dwarf_Bool *)(caller_ret_die_local + 4);
                context._4_4_ =
                     _dwarf_leb128_uword_wrapper
                               ((Dwarf_Debug)abbrev_code,&die_info_ptr2,(Dwarf_Small *)ret_die,
                                (Dwarf_Unsigned *)&dis,(Dwarf_Error *)die_info_ptr);
                if (context._4_4_ == 0) {
                  utmp = (Dwarf_Unsigned)dis;
                  pDStack_70->de_last_di_ptr = die_info_ptr2;
                  if (dis == (Dwarf_Debug_InfoTypes)0x0) {
                    while (((Dwarf_Die)pDStack_70->de_last_di_ptr < ret_die &&
                           (*pDStack_70->de_last_di_ptr == '\0'))) {
                      pDStack_70->de_last_di_ptr = pDStack_70->de_last_di_ptr + 1;
                    }
                    *error_local = (Dwarf_Error)0x0;
                    dwarf_dealloc((Dwarf_Debug)abbrev_code,pDStack_48,8);
                    die_local._4_4_ = -1;
                  }
                  else {
                    pDStack_48->di_abbrev_code = (Dwarf_Unsigned)dis;
                    highest_code._4_4_ =
                         _dwarf_get_abbrev_for_code
                                   (pDStack_48->di_cu_context,(Dwarf_Unsigned)dis,
                                    &pDStack_48->di_abbrev_list,(Dwarf_Unsigned *)&ckdi_dbg,
                                    (Dwarf_Error *)die_info_ptr);
                    if (highest_code._4_4_ == 1) {
                      dwarf_dealloc((Dwarf_Debug)abbrev_code,pDStack_48,8);
                      die_local._4_4_ = highest_code._4_4_;
                    }
                    else if (highest_code._4_4_ == -1) {
                      dwarfstring_constructor((dwarfstring_s *)local_b8);
                      dwarf_dealloc_die(pDStack_48);
                      pDStack_48 = (Dwarf_Die)0x0;
                      dwarfstring_append_printf_u
                                ((dwarfstring *)local_b8,
                                 "DW_DLE_ABBREV_MISSING: the abbrev code not found  in dwarf_child() is %u. "
                                 ,utmp);
                      dwarfstring_append_printf_u
                                ((dwarfstring *)local_b8,
                                 "The highest known code in any compilation unit is %u.",
                                 (dwarfstring_u)ckdi_dbg);
                      pDVar1 = die_info_ptr;
                      dbg_00 = abbrev_code;
                      msg = dwarfstring_string((dwarfstring_s *)local_b8);
                      _dwarf_error_string((Dwarf_Debug)dbg_00,(Dwarf_Error *)pDVar1,0x18a,msg);
                      dwarfstring_destructor((dwarfstring_s *)local_b8);
                      die_local._4_4_ = 1;
                    }
                    else {
                      if (pDStack_48->di_abbrev_list->abl_attr == (Dwarf_Half *)0x0) {
                        pDVar1 = pDStack_48->di_abbrev_list->abl_abbrev_ptr;
                        abbrev_end_00 =
                             _dwarf_calculate_abbrev_section_end_ptr(pDStack_48->di_cu_context);
                        iVar2 = _dwarf_fill_in_attr_form_abtable
                                          (pDStack_48->di_cu_context,pDVar1,abbrev_end_00,
                                           pDStack_48->di_abbrev_list,(Dwarf_Error *)die_info_ptr);
                        if (iVar2 != 0) {
                          dwarf_dealloc_die(pDStack_48);
                          return iVar2;
                        }
                      }
                      *error_local = (Dwarf_Error)pDStack_48;
                      die_local._4_4_ = 0;
                    }
                  }
                }
                else {
                  dwarf_dealloc_die(pDStack_48);
                  die_local._4_4_ = context._4_4_;
                }
              }
            }
          }
        }
      }
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_child(Dwarf_Die die,
    Dwarf_Die * caller_ret_die,
    Dwarf_Error * error)
{
    Dwarf_Byte_Ptr die_info_ptr = 0;
    Dwarf_Byte_Ptr die_info_ptr2 = 0;

    /* die_info_end points one-past-end of die area. */
    Dwarf_Byte_Ptr die_info_end = 0;
    Dwarf_Die ret_die = 0;
    Dwarf_Bool has_die_child = 0;
    Dwarf_Debug dbg;
    Dwarf_Unsigned abbrev_code = 0;
    Dwarf_Unsigned utmp = 0;
    Dwarf_Debug_InfoTypes dis = 0;
    int res = 0;
    Dwarf_CU_Context context = 0;
    int lres = 0;
    Dwarf_Unsigned highest_code = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    dis = die->di_is_info? &dbg->de_info_reading:
        &dbg->de_types_reading;
    die_info_ptr = die->di_debug_ptr;

    /*  We are saving a DIE pointer here, but the pointer
        will not be presumed live later, when it is tested. */
    dis->de_last_die = die;
    dis->de_last_di_ptr = die_info_ptr;

    /* NULL die has no child. */
    if ((*die_info_ptr) == 0) {
        return DW_DLV_NO_ENTRY;
    }
    context = die->di_cu_context;
    die_info_end = _dwarf_calculate_info_section_end_ptr(context);

    res = _dwarf_next_die_info_ptr(die_info_ptr,
        die->di_cu_context,
        die_info_end,
        NULL, FALSE,
        &has_die_child,
        &die_info_ptr2,
        error);
    if (res != DW_DLV_OK) {
        return res;
    }
    if (die_info_ptr == die_info_end) {
        return DW_DLV_NO_ENTRY;
    }
    die_info_ptr = die_info_ptr2;

    dis->de_last_di_ptr = die_info_ptr;

    if (!has_die_child) {
        /* Look for end of sibling chain. */
        while (dis->de_last_di_ptr < die_info_end) {
            if (*dis->de_last_di_ptr) {
                break;
            }
            ++dis->de_last_di_ptr;
        }
        return DW_DLV_NO_ENTRY;
    }

    ret_die = (Dwarf_Die) _dwarf_get_alloc(dbg, DW_DLA_DIE, 1);
    if (!ret_die) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    ret_die->di_debug_ptr = die_info_ptr;
    ret_die->di_cu_context = die->di_cu_context;
    ret_die->di_is_info = die->di_is_info;

    res =  _dwarf_leb128_uword_wrapper(dbg,&die_info_ptr,
        die_info_end, &utmp,error);
    if (res != DW_DLV_OK) {
        dwarf_dealloc_die(ret_die);
        return res;
    }
    abbrev_code = (Dwarf_Unsigned) utmp;

    dis->de_last_di_ptr = die_info_ptr;

    if (abbrev_code == 0) {
        /* Look for end of sibling chain */
        while (dis->de_last_di_ptr < die_info_end) {
            if (*dis->de_last_di_ptr) {
                break;
            }
            ++dis->de_last_di_ptr;
        }

        /*  We have arrived at a null DIE,
            at the end of a CU or the end
            of a list of siblings. */
        *caller_ret_die = 0;
        dwarf_dealloc(dbg, ret_die, DW_DLA_DIE);
        ret_die = 0;
        return DW_DLV_NO_ENTRY;
    }
    ret_die->di_abbrev_code = abbrev_code;
    lres = _dwarf_get_abbrev_for_code(ret_die->di_cu_context,
        abbrev_code,
        &ret_die->di_abbrev_list,
        &highest_code,error);
    if (lres == DW_DLV_ERROR) {
        dwarf_dealloc(dbg, ret_die, DW_DLA_DIE);
        ret_die = 0;
        return lres;
    }
    if (lres == DW_DLV_NO_ENTRY) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarf_dealloc_die(ret_die);
        ret_die = 0;
        dwarfstring_append_printf_u(&m,
            "DW_DLE_ABBREV_MISSING: the abbrev code not found "
            " in dwarf_child() is %u. ",abbrev_code);
        dwarfstring_append_printf_u(&m,
            "The highest known code"
            " in any compilation unit is %u.",
            highest_code);
        _dwarf_error_string(dbg, error, DW_DLE_ABBREV_MISSING,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    if (!ret_die->di_abbrev_list->abl_attr) {
        int bres = 0;
        Dwarf_Byte_Ptr abbrev_ptr =
            ret_die->di_abbrev_list->abl_abbrev_ptr;
        Dwarf_Byte_Ptr abbrev_end =
            _dwarf_calculate_abbrev_section_end_ptr(
            ret_die->di_cu_context);
        bres = _dwarf_fill_in_attr_form_abtable(
            ret_die->di_cu_context,
            abbrev_ptr,
            abbrev_end,
            ret_die->di_abbrev_list,
            error);
        if (bres != DW_DLV_OK) {
            dwarf_dealloc_die(ret_die);
            return bres;
        }
    }
    *caller_ret_die = ret_die;
    return DW_DLV_OK;
}